

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_sign_single
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,uchar *seckey32,uchar *secnonce32,
              uchar *extra32,secp256k1_pubkey *pubnonce_for_e,secp256k1_pubkey *pubnonce_total,
              secp256k1_pubkey *pubkey_for_e,uchar *seed)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  uchar *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  secp256k1_scalar tmp_scalar;
  int retry;
  int overflow;
  secp256k1_ge final;
  secp256k1_scalar secnonce;
  secp256k1_pubkey pub_tmp;
  secp256k1_gej pubnonce_total_j;
  secp256k1_gej pubnonce_j;
  secp256k1_ge total_tmp_ge;
  secp256k1_ge tmp_ge;
  secp256k1_scalar sec;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_scalar sighash;
  secp256k1_gej *in_stack_fffffffffffffca8;
  secp256k1_gej *in_stack_fffffffffffffcb0;
  secp256k1_scalar *in_stack_fffffffffffffcb8;
  secp256k1_scalar *in_stack_fffffffffffffcc0;
  secp256k1_gej *in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  secp256k1_gej *in_stack_fffffffffffffcd8;
  secp256k1_scalar *in_stack_fffffffffffffce0;
  secp256k1_context *in_stack_fffffffffffffce8;
  secp256k1_ge *in_stack_fffffffffffffcf0;
  secp256k1_context *in_stack_fffffffffffffcf8;
  secp256k1_ge *in_stack_fffffffffffffd00;
  secp256k1_scalar *in_stack_fffffffffffffd70;
  secp256k1_gej *in_stack_fffffffffffffd78;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffd80;
  secp256k1_scalar *in_stack_fffffffffffffd88;
  secp256k1_context *in_stack_fffffffffffffd90;
  secp256k1_ge *in_stack_fffffffffffffec0;
  secp256k1_gej *in_stack_fffffffffffffec8;
  secp256k1_gej *in_stack_fffffffffffffed0;
  secp256k1_fe local_118 [2];
  secp256k1_scalar local_c0 [4];
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  uchar *local_18;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = secp256k1_ecmult_gen_context_is_built((secp256k1_ecmult_gen_context *)(in_RDI + 8));
  if (iVar1 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
    local_4 = 0;
  }
  else if (local_18 == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
    local_4 = 0;
  }
  else if (local_20 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
    local_4 = 0;
  }
  else if (local_28 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
    local_4 = 0;
  }
  else if (tmp_scalar.d[3] == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
    local_4 = 0;
  }
  else {
    if (local_30 == 0) {
      secp256k1_rfc6979_hmac_sha256_initialize
                ((secp256k1_rfc6979_hmac_sha256 *)in_stack_fffffffffffffd80,
                 (uchar *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
      iVar1 = secp256k1_aggsig_generate_nonce_single
                        (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffcd8,
                         (secp256k1_rfc6979_hmac_sha256 *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)0x1168d0);
      secp256k1_ge_set_gej(in_stack_fffffffffffffd00,(secp256k1_gej *)in_stack_fffffffffffffcf8);
    }
    else {
      secp256k1_scalar_set_b32
                (in_stack_fffffffffffffcc0,(uchar *)in_stack_fffffffffffffcb8,
                 (int *)in_stack_fffffffffffffcb0);
      secp256k1_ecmult_gen
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      secp256k1_ge_set_gej(in_stack_fffffffffffffd00,(secp256k1_gej *)in_stack_fffffffffffffcf8);
      if (tmp_scalar.d[1] == 0) {
        iVar1 = secp256k1_gej_has_quad_y_var(in_stack_fffffffffffffcc8);
        if (iVar1 == 0) {
          secp256k1_scalar_negate(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          secp256k1_gej_neg(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffffcb0,
                           (secp256k1_ge *)in_stack_fffffffffffffca8);
        }
      }
      else {
        secp256k1_gej_set_infinity((secp256k1_gej *)0x116952);
        secp256k1_pubkey_load
                  (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                   (secp256k1_pubkey *)in_stack_fffffffffffffce8);
        secp256k1_gej_add_ge
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        iVar1 = secp256k1_gej_has_quad_y_var(in_stack_fffffffffffffcc8);
        if (iVar1 == 0) {
          secp256k1_scalar_negate(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        }
      }
    }
    secp256k1_fe_normalize(local_118);
    if (tmp_scalar.d[0] == 0) {
      secp256k1_pubkey_save
                ((secp256k1_pubkey *)in_stack_fffffffffffffcf0,
                 (secp256k1_ge *)in_stack_fffffffffffffce8);
      secp256k1_compute_sighash_single
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (secp256k1_pubkey *)in_stack_fffffffffffffd80,
                 (secp256k1_pubkey *)in_stack_fffffffffffffd78,(uchar *)in_stack_fffffffffffffd70);
    }
    else {
      secp256k1_compute_sighash_single
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (secp256k1_pubkey *)in_stack_fffffffffffffd80,
                 (secp256k1_pubkey *)in_stack_fffffffffffffd78,(uchar *)in_stack_fffffffffffffd70);
    }
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffcc0,(uchar *)in_stack_fffffffffffffcb8,
               (int *)in_stack_fffffffffffffcb0);
    if (in_stack_fffffffffffffcd4 == 0) {
      secp256k1_scalar_mul
                ((secp256k1_scalar *)in_stack_fffffffffffffcf0,
                 (secp256k1_scalar *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      secp256k1_scalar_add
                (in_stack_fffffffffffffce0,(secp256k1_scalar *)in_stack_fffffffffffffcd8,
                 (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      if (local_38 != 0) {
        secp256k1_scalar_set_b32
                  (in_stack_fffffffffffffcc0,(uchar *)in_stack_fffffffffffffcb8,
                   (int *)in_stack_fffffffffffffcb0);
        if (in_stack_fffffffffffffcd4 != 0) {
          secp256k1_scalar_clear(local_c0);
          return 0;
        }
        secp256k1_scalar_add
                  (in_stack_fffffffffffffce0,(secp256k1_scalar *)in_stack_fffffffffffffcd8,
                   (secp256k1_scalar *)(ulong)in_stack_fffffffffffffcd0);
      }
      secp256k1_ge_set_gej(in_stack_fffffffffffffd00,(secp256k1_gej *)in_stack_fffffffffffffcf8);
      secp256k1_fe_normalize_var((secp256k1_fe *)&stack0xfffffffffffffcd8);
      secp256k1_fe_get_b32(local_18,(secp256k1_fe *)&stack0xfffffffffffffcd8);
      secp256k1_scalar_get_b32(local_18 + 0x20,local_c0);
      secp256k1_scalar_clear(local_c0);
      local_4 = 1;
    }
    else {
      secp256k1_scalar_clear(local_c0);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_sign_single(const secp256k1_context* ctx,
    unsigned char *sig64,
    const unsigned char *msg32,
    const unsigned char *seckey32,
    const unsigned char* secnonce32,
    const unsigned char* extra32,
    const secp256k1_pubkey* pubnonce_for_e,
    const secp256k1_pubkey* pubnonce_total,
    const secp256k1_pubkey* pubkey_for_e,
    const unsigned char* seed){

    secp256k1_scalar sighash;
    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_scalar sec;
    secp256k1_ge tmp_ge;
    secp256k1_ge total_tmp_ge;
    secp256k1_gej pubnonce_j;
    secp256k1_gej pubnonce_total_j;
    secp256k1_pubkey pub_tmp;

    secp256k1_scalar secnonce;
    secp256k1_ge final;
    int overflow;
    int retry;
    secp256k1_scalar tmp_scalar;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(seed != NULL);

    /* generate nonce if needed */
    if (secnonce32==NULL){
        secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 32);
        if (secp256k1_aggsig_generate_nonce_single(ctx, &secnonce, &pubnonce_j, &rng) == 0){
            return 0;
        }
        secp256k1_rfc6979_hmac_sha256_finalize(&rng);
        secp256k1_ge_set_gej(&tmp_ge, &pubnonce_j);
    } else {
        secp256k1_scalar_set_b32(&secnonce, secnonce32, &retry);
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &pubnonce_j, &secnonce);
        secp256k1_ge_set_gej(&tmp_ge, &pubnonce_j);

        if (pubnonce_total!=NULL) {
            secp256k1_gej_set_infinity(&pubnonce_total_j);
            secp256k1_pubkey_load(ctx, &total_tmp_ge, pubnonce_total);
            secp256k1_gej_add_ge(&pubnonce_total_j, &pubnonce_total_j, &total_tmp_ge);
            if (!secp256k1_gej_has_quad_y_var(&pubnonce_total_j)) {
                secp256k1_scalar_negate(&secnonce, &secnonce);
            }
        } else {
            if (!secp256k1_gej_has_quad_y_var(&pubnonce_j)) {
                secp256k1_scalar_negate(&secnonce, &secnonce);
                secp256k1_gej_neg(&pubnonce_j, &pubnonce_j);
                secp256k1_ge_neg(&tmp_ge, &tmp_ge);
            }
        }
    }

    secp256k1_fe_normalize(&tmp_ge.x);

    /* compute signature hash (in the simple case just message+pubnonce+pubkey) */
    if (pubnonce_for_e != NULL) {
        secp256k1_compute_sighash_single(ctx, &sighash, pubnonce_for_e, pubkey_for_e, msg32);
    } else {
        secp256k1_pubkey_save(&pub_tmp, &tmp_ge);
        secp256k1_compute_sighash_single(ctx, &sighash, &pub_tmp, pubkey_for_e, msg32);
    }
    /* calculate signature */
    secp256k1_scalar_set_b32(&sec, seckey32, &overflow);
    if (overflow) {
        secp256k1_scalar_clear(&sec);
        return 0;
    }

    secp256k1_scalar_mul(&sec, &sec, &sighash);
    secp256k1_scalar_add(&sec, &sec, &secnonce);

    if (extra32 != NULL) {
        /* add extra scalar */
        secp256k1_scalar_set_b32(&tmp_scalar, extra32, &overflow);
        if (overflow) {
            secp256k1_scalar_clear(&sec);
            return 0;
        }
        secp256k1_scalar_add(&sec, &sec, &tmp_scalar);
    }

    /* finalize */
    secp256k1_ge_set_gej(&final, &pubnonce_j);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &sec);

    secp256k1_scalar_clear(&sec);

    return 1;
}